

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_remove_element_at
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  size_t sVar2;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  uint *in_RDI;
  CVmObjVector *unaff_retaddr;
  int start_idx;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe8;
  uint *start_idx_00;
  vm_obj_id_t in_stack_fffffffffffffffc;
  
  start_idx_00 = in_RDI;
  if ((getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remove_element_at::desc,1);
    __cxa_guard_release(&getp_remove_element_at(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_RDI,(CVmNativeCodeDesc *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 0) {
      sVar2 = get_element_count((CVmObjVector *)0x34ca4b);
      iVar1 = iVar1 + (int)sVar2 + 1;
    }
    if ((iVar1 < 1) || (sVar2 = get_element_count((CVmObjVector *)0x34ca77), (int)sVar2 < iVar1)) {
      err_throw(0);
    }
    vm_val_t::set_obj(in_RDX,in_ESI);
    remove_elements_undo
              (unaff_retaddr,in_stack_fffffffffffffffc,(size_t)start_idx_00,
               CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_element_at(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the deletion index; a negative index counts from the end */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx < 0)
        start_idx += get_element_count() + 1;

    /* make sure the index is in range */
    if (start_idx < 1 || start_idx > (int)get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* adjust to a zero-based index */
    --start_idx;

    /* the return value is 'self' */
    retval->set_obj(self);

    /* delete one element */
    remove_elements_undo(vmg_ self, start_idx, 1);


    /* handled */
    return TRUE;
}